

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

int FindAndDelete(CScript *script,CScript *b)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  CScript *pCVar5;
  const_iterator first;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  const_iterator last;
  int iVar9;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  opcodetype local_64;
  const_iterator local_60;
  direct_or_indirect local_58;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (b->super_CScriptBase)._size;
  uVar3 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar3 = uVar4;
  }
  if (uVar3 == 0) {
    iVar9 = 0;
  }
  else {
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_58._24_4_ = 0;
    uStack_3c = 0;
    local_58.indirect_contents.indirect = (char *)0x0;
    local_58.indirect_contents.capacity = 0;
    local_58._12_4_ = 0;
    uVar4 = (script->super_CScriptBase)._size;
    uVar3 = uVar4 - 0x1d;
    first.ptr = (uchar *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar4 < 0x1d) {
      uVar3 = uVar4;
      first.ptr = (uchar *)script;
    }
    last.ptr = (uchar *)((long)&(((CScript *)first.ptr)->super_CScriptBase)._union +
                        (long)(int)uVar3);
    iVar9 = 0;
    local_60.ptr = first.ptr;
    do {
      uVar4 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar4 = uStack_3c;
      }
      uVar7 = local_58.indirect_contents.indirect;
      if (uStack_3c < 0x1d) {
        uVar7 = &local_58;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                 (uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar7)->
                                  indirect + (long)(int)uVar4),first,local_60);
      uVar4 = (b->super_CScriptBase)._size;
      uVar3 = uVar4 - 0x1d;
      if (uVar4 < 0x1d) {
        uVar3 = uVar4;
      }
      uVar2 = (ulong)uVar3;
      iVar8 = (int)last.ptr;
      if (uVar2 <= (ulong)(long)(iVar8 - (int)local_60.ptr)) {
        pCVar5 = b;
        if (0x1c < uVar4) {
          pCVar5 = (CScript *)(b->super_CScriptBase)._union.indirect_contents.indirect;
        }
        do {
          if (uVar3 != 0) {
            lVar6 = 0;
            do {
              if ((pCVar5->super_CScriptBase)._union.direct[lVar6] != local_60.ptr[lVar6])
              goto LAB_00413366;
              lVar6 = lVar6 + 1;
            } while ((int)uVar3 != lVar6);
          }
          local_60.ptr = local_60.ptr + uVar2;
          iVar9 = iVar9 + 1;
        } while (uVar2 <= (ulong)(long)(iVar8 - (int)local_60.ptr));
      }
LAB_00413366:
      first.ptr = local_60.ptr;
      uVar4 = (script->super_CScriptBase)._size;
      uVar3 = uVar4 - 0x1d;
      if (uVar4 < 0x1d) {
        uVar3 = uVar4;
      }
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar4 < 0x1d) {
        pCVar5 = script;
      }
      bVar1 = GetScriptOp(&local_60,
                          (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar3),
                          &local_64,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
    } while (bVar1);
    if (iVar9 < 1) {
      if (0x1c < uStack_3c) {
        free(local_58.indirect_contents.indirect);
      }
    }
    else {
      uVar4 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar4 = uStack_3c;
      }
      uVar7 = local_58.indirect_contents.indirect;
      if (uStack_3c < 0x1d) {
        uVar7 = &local_58;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                 (uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar7)->
                                  indirect + (long)(int)uVar4),first,last);
      if (0x1c < (script->super_CScriptBase)._size) {
        free((script->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(ulong *)((long)&(script->super_CScriptBase)._union + 0xc) =
           CONCAT44(local_58._16_4_,local_58._12_4_);
      *(ulong *)((long)&(script->super_CScriptBase)._union + 0x14) =
           CONCAT44(local_58._24_4_,local_58._20_4_);
      (script->super_CScriptBase)._union.indirect_contents.indirect =
           local_58.indirect_contents.indirect;
      *(ulong *)((long)&(script->super_CScriptBase)._union + 8) =
           CONCAT44(local_58._12_4_,local_58.indirect_contents.capacity);
      (script->super_CScriptBase)._size = uStack_3c;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int FindAndDelete(CScript& script, const CScript& b)
{
    int nFound = 0;
    if (b.empty())
        return nFound;
    CScript result;
    CScript::const_iterator pc = script.begin(), pc2 = script.begin(), end = script.end();
    opcodetype opcode;
    do
    {
        result.insert(result.end(), pc2, pc);
        while (static_cast<size_t>(end - pc) >= b.size() && std::equal(b.begin(), b.end(), pc))
        {
            pc = pc + b.size();
            ++nFound;
        }
        pc2 = pc;
    }
    while (script.GetOp(pc, opcode));

    if (nFound > 0) {
        result.insert(result.end(), pc2, end);
        script = std::move(result);
    }

    return nFound;
}